

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URL.cpp
# Opt level: O2

string * __thiscall URL::GetPortNumber_abi_cxx11_(string *__return_storage_ptr__,URL *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_portNumber);
  return __return_storage_ptr__;
}

Assistant:

std::string URL::GetPortNumber() {
  return _portNumber;
}